

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  string *psVar1;
  undefined8 uVar2;
  _Any_data local_ff8;
  code *local_fe8;
  code *local_fe0;
  _Any_data local_fd8;
  code *local_fc8;
  code *local_fc0;
  _Any_data local_fb8;
  code *local_fa8;
  code *local_fa0;
  _Any_data local_f98;
  code *local_f88;
  code *local_f80;
  _Any_data local_f78;
  code *local_f68;
  code *local_f60;
  _Any_data local_f58;
  code *local_f48;
  code *local_f40;
  _Any_data local_f38;
  code *local_f28;
  code *local_f20;
  _Any_data local_f18;
  code *local_f08;
  code *local_f00;
  _Any_data local_ef8;
  code *local_ee8;
  code *local_ee0;
  _Any_data local_ed8;
  code *local_ec8;
  code *local_ec0;
  _Any_data local_eb8;
  code *local_ea8;
  code *local_ea0;
  _Any_data local_e98;
  code *local_e88;
  code *local_e80;
  _Any_data local_e78;
  code *local_e68;
  code *local_e60;
  _Any_data local_e58;
  code *local_e48;
  code *local_e40;
  _Any_data local_e38;
  code *local_e28;
  code *local_e20;
  _Any_data local_e18;
  code *local_e08;
  code *local_e00;
  _Any_data local_df8;
  code *local_de8;
  code *local_de0;
  _Any_data local_dd8;
  code *local_dc8;
  code *local_dc0;
  _Any_data local_db8;
  code *local_da8;
  code *local_da0;
  _Any_data local_d98;
  code *local_d88;
  code *local_d80;
  _Any_data local_d78;
  code *local_d68;
  code *local_d60;
  string local_d58 [32];
  string local_d38 [32];
  _Any_data local_d18;
  code *local_d08;
  code *local_d00;
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  string local_798;
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  string local_538;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [32];
  string local_138 [32];
  _Function_base local_118;
  undefined1 local_f8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  allocator<char> local_91;
  allocator<char> local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator<char> local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator<char> local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  OptimizationOptions *local_38;
  
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  (this->super_ToolOptions)._vptr_ToolOptions = (_func_int **)&PTR_addPassArg_001a47a0;
  this->allowStackIR = true;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"-O",&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"execute default optimization passes (equivalent to -Os)",
             &local_8f);
  std::__cxx11::string::string<std::allocator<char>>(local_158,"Optimization options",&local_8e);
  local_c8 = (string *)&(local_38->super_ToolOptions).super_Options;
  local_1b8._8_8_ = 0;
  local_1b8._M_unused._M_function_pointer = (_func_void *)local_38;
  local_1a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:96:9)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:96:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (local_c8,(string *)local_f8,(string *)&local_198,(string *)&local_178,
                      (Arguments)local_158,(function *)0x0,SUB81(&local_1b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_8d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"-O0",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"execute no optimization passes",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"Optimization options",&local_8a);
  local_d18._8_8_ = 0;
  local_d18._M_unused._M_object = local_38;
  local_d00 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:109:12)>
              ::_M_invoke;
  local_d08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:109:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_138,(string *)&local_118,(string *)&local_c0,(Arguments)local_1f8
                      ,(function *)0x0,SUB81(&local_d18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_cf8,"-O1",&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            (local_cd8,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)",
             &local_87);
  std::__cxx11::string::string<std::allocator<char>>(local_cb8,"Optimization options",&local_86);
  local_ff8._8_8_ = 0;
  local_ff8._M_unused._M_object = local_38;
  local_fe0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:119:12)>
              ::_M_invoke;
  local_fe8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:119:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_1d8,local_cf8,local_cd8,(Arguments)local_cb8,(function *)0x0,
                      SUB81(&local_ff8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c98,"",&local_85);
  std::__cxx11::string::string<std::allocator<char>>(local_c78,"-O2",&local_84);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c58,"execute -O2 optimization passes (most opts, generally gets most perf)",
             &local_83);
  std::__cxx11::string::string<std::allocator<char>>(local_c38,"Optimization options",&local_82);
  local_fd8._8_8_ = 0;
  local_fd8._M_unused._M_object = local_38;
  local_fc0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:130:9)>
              ::_M_invoke;
  local_fc8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:130:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_c98,local_c78,local_c58,(Arguments)local_c38,(function *)0x0,
                      SUB81(&local_fd8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c18,"",&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"-O3",&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bd8,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)",
             &local_7f);
  std::__cxx11::string::string<std::allocator<char>>(local_bb8,"Optimization options",&local_7e);
  local_fb8._8_8_ = 0;
  local_fb8._M_unused._M_object = local_38;
  local_fa0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:141:12)>
              ::_M_invoke;
  local_fa8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:141:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_c18,local_bf8,local_bd8,(Arguments)local_bb8,(function *)0x0,
                      SUB81(&local_fb8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"",&local_7d);
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"-O4",&local_7c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b58,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,&local_7b);
  std::__cxx11::string::string<std::allocator<char>>(local_b38,"Optimization options",&local_7a);
  local_f98._8_8_ = 0;
  local_f98._M_unused._M_object = local_38;
  local_f80 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:153:12)>
              ::_M_invoke;
  local_f88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:153:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_b98,local_b78,local_b58,(Arguments)local_b38,(function *)0x0,
                      SUB81(&local_f98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b18,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>(local_af8,"-Os",&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ad8,"execute default optimization passes, focusing on code size",&local_77);
  std::__cxx11::string::string<std::allocator<char>>(local_ab8,"Optimization options",&local_76);
  local_f78._8_8_ = 0;
  local_f78._M_unused._M_object = local_38;
  local_f60 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:163:12)>
              ::_M_invoke;
  local_f68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:163:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_b18,local_af8,local_ad8,(Arguments)local_ab8,(function *)0x0,
                      SUB81(&local_f78,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"",&local_75);
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"-Oz",&local_74);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a58,"execute default optimization passes, super-focusing on code size",&local_73)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_a38,"Optimization options",&local_72);
  local_f58._8_8_ = 0;
  local_f58._M_unused._M_object = local_38;
  local_f40 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:173:12)>
              ::_M_invoke;
  local_f48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:173:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_a98,local_a78,local_a58,(Arguments)local_a38,(function *)0x0,
                      SUB81(&local_f58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a18,"--optimize-level",&local_71);
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"-ol",&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d8,"How much to focus on optimizing code",&local_6f);
  std::__cxx11::string::string<std::allocator<char>>(local_9b8,"Optimization options",&local_6e);
  local_f38._8_8_ = 0;
  local_f38._M_unused._M_object = local_38;
  local_f20 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:183:12)>
              ::_M_invoke;
  local_f28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:183:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_a18,local_9f8,local_9d8,(Arguments)local_9b8,(function *)0x1,
                      SUB81(&local_f38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_998,"--shrink-level",&local_6d);
  std::__cxx11::string::string<std::allocator<char>>(local_978,"-s",&local_6c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_958,"How much to focus on shrinking code size",&local_6b);
  std::__cxx11::string::string<std::allocator<char>>(local_938,"Optimization options",&local_6a);
  local_f18._8_8_ = 0;
  local_f18._M_unused._M_object = local_38;
  local_f00 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_invoke;
  local_f08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_998,local_978,local_958,(Arguments)local_938,(function *)0x1,
                      SUB81(&local_f18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_918,"--debuginfo",&local_69);
  std::__cxx11::string::string<std::allocator<char>>(local_8f8,"-g",&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d8,"Emit names section in wasm binary (or full debuginfo in wast)",&local_67);
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"Optimization options",&local_66);
  local_ef8._8_8_ = 0;
  local_ef8._M_unused._M_object = local_38;
  local_ee0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:199:12)>
              ::_M_invoke;
  local_ee8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:199:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_918,local_8f8,local_8d8,(Arguments)local_8b8,(function *)0x0,
                      SUB81(&local_ef8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_898,"--no-stack-ir",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_878,"",&local_64);
  std::__cxx11::string::string<std::allocator<char>>
            (local_858,"do not use StackIR (even when it is the default)",&local_63);
  std::__cxx11::string::string<std::allocator<char>>(local_838,"Tool options",&local_62);
  local_ed8._8_8_ = 0;
  local_ed8._M_unused._M_object = local_38;
  local_ec0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:207:12)>
              ::_M_invoke;
  local_ec8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:207:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_898,local_878,local_858,(Arguments)local_838,(function *)0x0,
                      SUB81(&local_ed8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_818,"--always-inline-max-function-size",&local_61);
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"-aimfs",&local_60);
  std::__cxx11::to_string(&local_798,2);
  std::operator+(&local_7b8,"Max size of functions that are always inlined (default ",&local_798);
  std::operator+(&local_7d8,&local_7b8,", which is safe for use with -Os builds)");
  std::__cxx11::string::string<std::allocator<char>>(local_778,"Optimization options",&local_5f);
  local_eb8._8_8_ = 0;
  local_eb8._M_unused._M_object = local_38;
  local_ea0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:220:12)>
              ::_M_invoke;
  local_ea8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:220:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_818,local_7f8,(string *)&local_7d8,(Arguments)local_778,
                      (function *)0x1,SUB81(&local_eb8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_758,"--flexible-inline-max-function-size",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>(local_738,"-fimfs",&local_5d);
  std::__cxx11::to_string(&local_6f8,0x14);
  std::operator+(&local_718,
                 "Max size of functions that are inlined when lightweight (no loops or function calls) when optimizing aggressively for speed (-O3). Default: "
                 ,&local_6f8);
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"Optimization options",&local_5c);
  local_e98._8_8_ = 0;
  local_e98._M_unused._M_object = local_38;
  local_e80 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:232:12)>
              ::_M_invoke;
  local_e88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:232:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_758,local_738,(string *)&local_718,(Arguments)local_6d8,
                      (function *)0x1,SUB81(&local_e98,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,"--one-caller-inline-max-function-size",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>(local_698,"-ocimfs",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,&local_59);
  std::__cxx11::string::string<std::allocator<char>>(local_658,"Optimization options",&local_58);
  local_e78._8_8_ = 0;
  local_e78._M_unused._M_object = local_38;
  local_e60 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:242:12)>
              ::_M_invoke;
  local_e68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:242:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_6b8,local_698,local_678,(Arguments)local_658,(function *)0x1,
                      SUB81(&local_e78,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,"--inline-functions-with-loops",&local_57);
  std::__cxx11::string::string<std::allocator<char>>(local_618,"-ifwl",&local_56);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"Allow inlining functions with loops",&local_55);
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"Optimization options",&local_54);
  local_e58._8_8_ = 0;
  local_e58._M_unused._M_object = local_38;
  local_e40 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_invoke;
  local_e48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_638,local_618,local_5f8,(Arguments)local_5d8,(function *)0x0,
                      SUB81(&local_e58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"--partial-inlining-ifs",&local_53);
  std::__cxx11::string::string<std::allocator<char>>(local_598,"-pii",&local_52);
  std::__cxx11::to_string(&local_538,0);
  std::operator+(&local_558,
                 "Number of ifs allowed in partial inlining (zero means partial inlining is disabled) (default: "
                 ,&local_538);
  std::operator+(&local_578,&local_558,')');
  std::__cxx11::string::string<std::allocator<char>>(local_518,"Optimization options",&local_51);
  local_e38._8_8_ = 0;
  local_e38._M_unused._M_object = local_38;
  local_e20 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:264:12)>
              ::_M_invoke;
  local_e28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:264:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_5b8,local_598,(string *)&local_578,(Arguments)local_518,
                      (function *)0x1,SUB81(&local_e38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"--ignore-implicit-traps",&local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"-iit",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"Optimization options",&local_4d);
  local_e18._8_8_ = 0;
  local_e18._M_unused._M_object = local_38;
  local_e00 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:274:12)>
              ::_M_invoke;
  local_e08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:274:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_4f8,local_4d8,local_4b8,(Arguments)local_498,(function *)0x0,
                      SUB81(&local_e18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_478,"--traps-never-happen",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_458,"-tnh",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,&local_4a);
  std::__cxx11::string::string<std::allocator<char>>(local_418,"Optimization options",&local_49);
  local_df8._8_8_ = 0;
  local_df8._M_unused._M_object = local_38;
  local_de0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:283:12)>
              ::_M_invoke;
  local_de8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:283:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_478,local_458,local_438,(Arguments)local_418,(function *)0x0,
                      SUB81(&local_df8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"--low-memory-unused",&local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"-lmu",&local_47);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"Optimization options",&local_45);
  local_dd8._8_8_ = 0;
  local_dd8._M_unused._M_object = local_38;
  local_dc0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:292:12)>
              ::_M_invoke;
  local_dc8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:292:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_3f8,local_3d8,local_3b8,(Arguments)local_398,(function *)0x0,
                      SUB81(&local_dd8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_378,"--fast-math",&local_44);
  std::__cxx11::string::string<std::allocator<char>>(local_358,"-ffm",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"Optimize floats without handling corner cases of NaNs and rounding",
             &local_42);
  std::__cxx11::string::string<std::allocator<char>>(local_318,"Optimization options",&local_41);
  local_db8._8_8_ = 0;
  local_db8._M_unused._M_object = local_38;
  local_da0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:301:9)>
              ::_M_invoke;
  local_da8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:301:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_378,local_358,local_338,(Arguments)local_318,(function *)0x0,
                      SUB81(&local_db8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--zero-filled-memory",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"-uim",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,"Assume that an imported memory will be zero-initialized",&local_3e);
  std::__cxx11::string::string<std::allocator<char>>(local_298,"Optimization options",&local_3d);
  local_d98._8_8_ = 0;
  local_d98._M_unused._M_object = local_38;
  local_d80 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:307:12)>
              ::_M_invoke;
  local_d88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:307:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_2f8,local_2d8,local_2b8,(Arguments)local_298,(function *)0x0,
                      SUB81(&local_d98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_278,"--skip-pass",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>(local_258,"-sp",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"Skip a pass (do not run it)",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>(local_218,"Optimization options",&local_39);
  local_d78._8_8_ = 0;
  local_d78._M_unused._M_object = local_38;
  local_d60 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:315:12)>
              ::_M_invoke;
  local_d68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/optimization-options.h:315:12)>
              ::_M_manager;
  ::wasm::Options::add
            (psVar1,local_278,local_258,local_238,(Arguments)local_218,(function *)0x2,
             SUB81(&local_d78,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_d78);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::_Function_base::~_Function_base((_Function_base *)&local_d98);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_db8);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_378);
  std::_Function_base::~_Function_base((_Function_base *)&local_dd8);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_3f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_df8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_478);
  std::_Function_base::~_Function_base((_Function_base *)&local_e18);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e38);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e58);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_638);
  std::_Function_base::~_Function_base((_Function_base *)&local_e78);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_6b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e98);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::_Function_base::~_Function_base((_Function_base *)&local_eb8);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::_Function_base::~_Function_base((_Function_base *)&local_ed8);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_898);
  std::_Function_base::~_Function_base((_Function_base *)&local_ef8);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_918);
  std::_Function_base::~_Function_base((_Function_base *)&local_f18);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_998);
  std::_Function_base::~_Function_base((_Function_base *)&local_f38);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_a18);
  std::_Function_base::~_Function_base((_Function_base *)&local_f58);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_a98);
  std::_Function_base::~_Function_base((_Function_base *)&local_f78);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_b18);
  std::_Function_base::~_Function_base((_Function_base *)&local_f98);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_b78);
  std::__cxx11::string::~string(local_b98);
  std::_Function_base::~_Function_base((_Function_base *)&local_fb8);
  std::__cxx11::string::~string(local_bb8);
  std::__cxx11::string::~string(local_bd8);
  std::__cxx11::string::~string(local_bf8);
  std::__cxx11::string::~string(local_c18);
  std::_Function_base::~_Function_base((_Function_base *)&local_fd8);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_c78);
  std::__cxx11::string::~string(local_c98);
  std::_Function_base::~_Function_base((_Function_base *)&local_ff8);
  std::__cxx11::string::~string(local_cb8);
  std::__cxx11::string::~string(local_cd8);
  std::__cxx11::string::~string(local_cf8);
  std::__cxx11::string::~string(local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d18);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string(local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)local_f8);
  ::wasm::PassRegistry::get();
  ::wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  local_d0 = local_c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (local_a0 = local_c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        local_c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != local_d0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"--",(allocator<char> *)local_1f8);
    std::operator+(&local_198,&local_178,local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_158,"",(allocator<char> *)local_d18._M_pod_data);
    uVar2 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_d58,(string *)local_a0);
    ::wasm::PassRegistry::getPassDescription(&local_1b8,uVar2,local_d58);
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"Optimization passes",(allocator<char> *)local_1d8);
    local_f8._0_8_ = local_38;
    std::__cxx11::string::string((string *)(local_f8 + 8),(string *)local_a0);
    std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
    function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_24_,void>
              ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_118,
               (anon_class_40_2_fd512ddd *)local_f8);
    uVar2 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_d38,(string *)local_a0);
    ::wasm::PassRegistry::isPassHidden(uVar2,local_d38);
    ::wasm::Options::add
              (local_c8,(string *)&local_198,local_158,(string *)local_1b8._M_pod_data,
               (Arguments)local_138,(function *)0x3,SUB81(&local_118,0));
    std::__cxx11::string::~string(local_d38);
    std::_Function_base::~_Function_base(&local_118);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)local_1b8._M_pod_data);
    std::__cxx11::string::~string(local_d58);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    local_c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_a0 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--no-stack-ir",
           "",
           "do not use StackIR (even when it is the default)",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             allowStackIR = false;
             passOptions.generateStackIR = false;
             passOptions.optimizeStackIR = false;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          PassInfo info(p);
          if (!arg.empty()) {
            info.argument = arg;
          }

          passes.push_back(info);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }